

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int ARKStepSetNonlinCRDown(void *arkode_mem,realtype crdown)

{
  double in_XMM0_Qa;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,(ARKodeARKStepMem *)0xe87b3a);
  if (local_4 == 0) {
    if (0.0 < in_XMM0_Qa) {
      *(double *)((long)in_stack_ffffffffffffffd8 + 0xb8) = in_XMM0_Qa;
    }
    else {
      *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0xb8) = 0x3fd3333333333333;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ARKStepSetNonlinCRDown(void *arkode_mem, realtype crdown)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetNonlinCRDown",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* if argument legal set it, otherwise set default */
  if (crdown <= ZERO) {
    step_mem->crdown = CRDOWN;
  } else {
    step_mem->crdown = crdown;
  }

  return(ARK_SUCCESS);
}